

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void measure_map<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>,EasyUseDenseHashMap<HashObject<8,8>*,int,HashFn>>
               (char *label,int obj_size,int iters,bool stress_hash_function)

{
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  int in_stack_00000034;
  int in_stack_00000084;
  int in_stack_00000094;
  int in_stack_000000a4;
  int in_stack_000000f4;
  
  printf("\n%s (%d byte objects, %d iterations):\n",in_RDI,(ulong)in_ESI,(ulong)in_EDX);
  time_map_grow<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000094);
  time_map_grow_predicted<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000094);
  time_map_replace<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000094);
  time_map_fetch_random<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000034);
  time_map_fetch_sequential<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000034);
  time_map_fetch_empty<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_000000a4);
  time_map_remove<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000084);
  time_map_toggle<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_00000094);
  time_map_iterate<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(in_stack_000000f4);
  if ((in_CL & 1) != 0) {
    puts("");
    stresshashfunction<EasyUseDenseHashMap<HashObject<8,8>*,int,HashFn>>(in_ESI);
  }
  return;
}

Assistant:

static void measure_map(const char* label, int obj_size, int iters,
                        bool stress_hash_function) {
  printf("\n%s (%d byte objects, %d iterations):\n", label, obj_size, iters);
  if (1) time_map_grow<MapType>(iters);
  if (1) time_map_grow_predicted<MapType>(iters);
  if (1) time_map_replace<MapType>(iters);
  if (1) time_map_fetch_random<MapType>(iters);
  if (1) time_map_fetch_sequential<MapType>(iters);
  if (1) time_map_fetch_empty<MapType>(iters);
  if (1) time_map_remove<MapType>(iters);
  if (1) time_map_toggle<MapType>(iters);
  if (1) time_map_iterate<MapType>(iters);
  // This last test is useful only if the map type uses hashing.
  // And it's slow, so use fewer iterations.
  if (stress_hash_function) {
    // Blank line in the output makes clear that what follows isn't part of the
    // table of results that we just printed.
    puts("");
    stresshashfunction<StressMapType>(iters / 4);
  }
}